

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::RegularExpression::matchString
          (RegularExpression *this,Context *context,XMLCh *literal,XMLSize_t *offset,bool ignoreCase
          )

{
  short *psVar1;
  bool bVar2;
  int offset1;
  ulong charCount;
  
  charCount = 0;
  if (literal != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)literal + charCount);
      charCount = charCount + 2;
    } while (*psVar1 != 0);
    charCount = ((long)charCount >> 1) - 1;
  }
  if (context->fLimit - *offset < charCount) {
    bVar2 = false;
  }
  else {
    offset1 = (int)*offset;
    if (ignoreCase) {
      bVar2 = XMLString::regionIMatches(context->fString,offset1,literal,0,charCount);
    }
    else {
      bVar2 = XMLString::regionMatches(context->fString,offset1,literal,0,charCount);
    }
    if (bVar2 != false) {
      *offset = *offset + charCount;
    }
  }
  return bVar2;
}

Assistant:

bool RegularExpression::matchString(Context* const context,
                                    const XMLCh* const literal, XMLSize_t& offset,
                                    const bool ignoreCase) const
{
    XMLSize_t length = XMLString::stringLen(literal);

    if (context->fLimit - offset < length)
        return false;

    bool match = ignoreCase ? XMLString::regionIMatches(context->fString, (int)offset,
                                                        literal, 0, length)
                            : XMLString::regionMatches(context->fString, (int)offset,
                                                       literal, 0, length);
    if (match) offset += length;
    return match;
}